

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint lodepng_chunk_create(uchar **out,size_t *outlength,uint length,char *type,uchar *data)

{
  long lVar1;
  uint uVar2;
  uchar *puVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  
  uVar6 = (ulong)length;
  uVar4 = uVar6 + 0xc + *outlength;
  uVar2 = 0x4d;
  if (length + 0xc <= uVar4 && !CARRY8(uVar6 + 0xc,*outlength)) {
    puVar3 = (uchar *)realloc(*out,uVar4);
    if (puVar3 == (uchar *)0x0) {
      uVar2 = 0x53;
    }
    else {
      *out = puVar3;
      *outlength = uVar4;
      lVar5 = uVar4 - uVar6;
      puVar3[lVar5 + -0xc] = (uchar)(length >> 0x18);
      puVar3[lVar5 + -0xb] = (uchar)(length >> 0x10);
      puVar3[lVar5 + -10] = (uchar)(length >> 8);
      puVar3[lVar5 + -9] = (uchar)length;
      *(undefined4 *)(puVar3 + lVar5 + -8) = *(undefined4 *)type;
      if (length != 0) {
        uVar4 = 8;
        do {
          (puVar3 + lVar5 + -0xc)[uVar4 & 0xffffffff] = data[uVar4 - 8];
          lVar1 = (1 - uVar6) + uVar4;
          uVar4 = uVar4 + 1;
        } while (lVar1 != 8);
      }
      lodepng_chunk_generate_crc(puVar3 + lVar5 + -0xc);
      uVar2 = 0;
    }
  }
  return uVar2;
}

Assistant:

unsigned lodepng_chunk_create(unsigned char** out, size_t* outlength, unsigned length,
                              const char* type, const unsigned char* data)
{
  unsigned i;
  unsigned char *chunk, *new_buffer;
  size_t new_length = (*outlength) + length + 12;
  if(new_length < length + 12 || new_length < (*outlength)) return 77; /*integer overflow happened*/
  new_buffer = (unsigned char*)lodepng_realloc(*out, new_length);
  if(!new_buffer) return 83; /*alloc fail*/
  (*out) = new_buffer;
  (*outlength) = new_length;
  chunk = &(*out)[(*outlength) - length - 12];

  /*1: length*/
  lodepng_set32bitInt(chunk, (unsigned)length);

  /*2: chunk name (4 letters)*/
  chunk[4] = (unsigned char)type[0];
  chunk[5] = (unsigned char)type[1];
  chunk[6] = (unsigned char)type[2];
  chunk[7] = (unsigned char)type[3];

  /*3: the data*/
  for(i = 0; i != length; ++i) chunk[8 + i] = data[i];

  /*4: CRC (of the chunkname characters and the data)*/
  lodepng_chunk_generate_crc(chunk);

  return 0;
}